

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_DEF(Context *ctx)

{
  char local_d8 [8];
  char val3 [32];
  char val2 [32];
  char val1 [32];
  char val0 [32];
  char dst [64];
  float *val;
  Context *ctx_local;
  
  get_ARB1_destarg_varname(ctx,val0 + 0x18,0x40);
  floatstr(ctx,val1 + 0x18,0x20,(float)ctx->dwords[0],1);
  floatstr(ctx,val2 + 0x18,0x20,(float)ctx->dwords[1],1);
  floatstr(ctx,val3 + 0x18,0x20,(float)ctx->dwords[2],1);
  floatstr(ctx,local_d8,0x20,(float)ctx->dwords[3],1);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"PARAM %s = { %s, %s, %s, %s };",val0 + 0x18,val1 + 0x18,val2 + 0x18,val3 + 0x18,
              local_d8);
  pop_output(ctx);
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(SETP)

static void emit_ARB1_DEF(Context *ctx)
{
    const float *val = (const float *) ctx->dwords; // !!! FIXME: could be int?
    char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    char val0[32]; floatstr(ctx, val0, sizeof (val0), val[0], 1);
    char val1[32]; floatstr(ctx, val1, sizeof (val1), val[1], 1);
    char val2[32]; floatstr(ctx, val2, sizeof (val2), val[2], 1);
    char val3[32]; floatstr(ctx, val3, sizeof (val3), val[3], 1);

    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s = { %s, %s, %s, %s };",
                dst, val0, val1, val2, val3);
    pop_output(ctx);
}